

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O1

UStringTrieResult __thiscall
icu_63::BytesTrie::nextImpl(BytesTrie *this,uint8_t *pos,int32_t inByte)

{
  byte bVar1;
  UStringTrieResult in_EAX;
  int iVar2;
  byte *pos_00;
  
  do {
    pos_00 = pos + 1;
    bVar1 = *pos;
    if (bVar1 < 0x10) {
      in_EAX = branchNext(this,pos_00,(uint)bVar1,inByte);
      iVar2 = 1;
    }
    else if (bVar1 < 0x20) {
      pos_00 = pos + 2;
      iVar2 = 2;
      if ((uint)pos[1] == inByte) {
        this->remainingMatchLength_ = bVar1 - 0x11;
        this->pos_ = pos_00;
        if ((bVar1 == 0x10) && (0x1f < *pos_00)) {
          in_EAX = *pos_00 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
          iVar2 = 1;
        }
        else {
          in_EAX = USTRINGTRIE_NO_VALUE;
          iVar2 = 1;
        }
      }
    }
    else {
      iVar2 = 2;
      if ((bVar1 & 1) == 0) {
        iVar2 = 0;
        if (0xa1 < bVar1) {
          if (bVar1 < 0xd8) {
            pos_00 = pos + 2;
            iVar2 = 0;
          }
          else if (bVar1 < 0xfc) {
            pos_00 = pos + 3;
            iVar2 = 0;
          }
          else {
            pos_00 = pos + (ulong)((bVar1 >> 1 & 1) != 0) + 4;
            iVar2 = 0;
          }
        }
      }
    }
    pos = pos_00;
  } while (iVar2 == 0);
  if (iVar2 != 1) {
    this->pos_ = (uint8_t *)0x0;
    in_EAX = USTRINGTRIE_NO_MATCH;
  }
  return in_EAX;
}

Assistant:

UStringTrieResult
BytesTrie::nextImpl(const uint8_t *pos, int32_t inByte) {
    for(;;) {
        int32_t node=*pos++;
        if(node<kMinLinearMatch) {
            return branchNext(pos, node, inByte);
        } else if(node<kMinValueLead) {
            // Match the first of length+1 bytes.
            int32_t length=node-kMinLinearMatch;  // Actual match length minus 1.
            if(inByte==*pos++) {
                remainingMatchLength_=--length;
                pos_=pos;
                return (length<0 && (node=*pos)>=kMinValueLead) ?
                        valueResult(node) : USTRINGTRIE_NO_VALUE;
            } else {
                // No match.
                break;
            }
        } else if(node&kValueIsFinal) {
            // No further matching bytes.
            break;
        } else {
            // Skip intermediate value.
            pos=skipValue(pos, node);
            // The next node must not also be a value node.
            U_ASSERT(*pos<kMinValueLead);
        }
    }
    stop();
    return USTRINGTRIE_NO_MATCH;
}